

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_TransferPointer
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  int selector;
  int selector_00;
  int flags;
  bool bVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  char *pcVar6;
  int toSlot;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003d8de5;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d8dd5:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d8de5:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x35f,
                  "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_003d8cea;
    bVar2 = DObject::IsKindOf((DObject *)pAVar4,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d8de5;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_003d8dd5;
LAB_003d8cea:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
LAB_003d8e0d:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x360,
                  "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar6 = "param[paramnum].Type == REGT_INT";
    goto LAB_003d8e0d;
  }
  if ((uint)numparam < 3) {
    pcVar6 = "(paramnum) < numparam";
LAB_003d8e35:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x361,
                  "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar6 = "param[paramnum].Type == REGT_INT";
    goto LAB_003d8e35;
  }
  if (numparam == 3) {
    pcVar6 = "(paramnum) < numparam";
LAB_003d8e5d:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x362,
                  "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar6 = "param[paramnum].Type == REGT_INT";
    goto LAB_003d8e5d;
  }
  pVVar1 = param + 1;
  selector = param[2].field_0.i;
  selector_00 = param[3].field_0.i;
  if ((uint)numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d8e85;
    }
    toSlot = param[4].field_0.i;
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_003d8e85:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x363,
                    "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    toSlot = param[4].field_0.i;
    if (numparam != 5) {
      if (param[5].field_0.field_3.Type == '\0') goto LAB_003d8d7b;
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d8ea4;
    }
    param = defaultparam->Array;
  }
  if (param[5].field_0.field_3.Type == '\0') {
LAB_003d8d7b:
    flags = param[5].field_0.i;
    pAVar3 = COPY_AAPTR(pAVar4,(pVVar1->field_0).i);
    pAVar4 = COPY_AAPTR(pAVar4,selector);
    if (pAVar4 != (AActor *)0x0) {
      pAVar5 = COPY_AAPTR(pAVar3,selector_00);
      pAVar3 = (AActor *)0x0;
      if (pAVar5 != pAVar4) {
        pAVar3 = pAVar5;
      }
      if (toSlot == 0) {
        toSlot = selector_00;
      }
      ASSIGN_AAPTR(pAVar4,toSlot,pAVar3,flags);
    }
    return 0;
  }
  pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d8ea4:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x364,
                "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_TransferPointer)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(ptr_source);
	PARAM_INT		(ptr_recipient);
	PARAM_INT		(ptr_sourcefield);
	PARAM_INT_DEF	(ptr_recipientfield);
	PARAM_INT_DEF	(flags);

	AActor *source, *recipient;

	// Exchange pointers with actors to whom you have pointers (or with yourself, if you must)
	source = COPY_AAPTR(self, ptr_source);
	recipient = COPY_AAPTR(self, ptr_recipient);	// pick an actor to store the provided pointer value
	if (recipient == NULL)
	{
		return 0;
	}

	// convert source from dataprovider to data
	source = COPY_AAPTR(source, ptr_sourcefield);
	if (source == recipient)
	{ // The recepient should not acquire a pointer to itself; will write NULL}
		source = NULL;
	}
	if (ptr_recipientfield == AAPTR_DEFAULT)
	{ // If default: Write to same field as data was read from
		ptr_recipientfield = ptr_sourcefield;
	}
	ASSIGN_AAPTR(recipient, ptr_recipientfield, source, flags);
	return 0;
}